

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void Cmd_playerclasses(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  FPlayerClass *pFVar2;
  char *pcVar3;
  char *pcVar4;
  uint local_20;
  uint i;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_20 = 0;
  while( true ) {
    uVar1 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
    if (uVar1 <= local_20) break;
    pFVar2 = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(ulong)local_20);
    pcVar3 = FName::GetChars(&(pFVar2->Type->super_PClassActor).super_PClass.super_PNativeStruct.
                              super_PStruct.super_PNamedType.TypeName);
    pFVar2 = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(ulong)local_20);
    pcVar4 = FString::GetChars(&pFVar2->Type->DisplayName);
    Printf("%3d: Class = %s, Name = %s\n",(ulong)local_20,pcVar3,pcVar4);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

CCMD (playerclasses)
{
	for (unsigned int i = 0; i < PlayerClasses.Size (); i++)
	{
		Printf ("%3d: Class = %s, Name = %s\n", i,
			PlayerClasses[i].Type->TypeName.GetChars(),
			PlayerClasses[i].Type->DisplayName.GetChars());
	}
}